

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyResyn.c
# Opt level: O1

Ivy_Man_t * Ivy_ManResyn(Ivy_Man_t *pMan,int fUpdateLevel,int fVerbose)

{
  int iVar1;
  Ivy_Man_t *pIVar2;
  Ivy_Man_t *pIVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  timespec ts;
  timespec local_38;
  
  if (fVerbose != 0) {
    puts("Original:");
    Ivy_ManPrintStats(pMan);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pIVar2 = Ivy_ManBalance(pMan,fUpdateLevel);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Ivy_ManRewritePre(pIVar2,fUpdateLevel,0,0);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Rewrite");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pIVar3 = Ivy_ManBalance(pIVar2,fUpdateLevel);
  Ivy_ManStop(pIVar2);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar3);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Ivy_ManRewritePre(pIVar3,fUpdateLevel,1,0);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Rewrite");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar3);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pIVar2 = Ivy_ManBalance(pIVar3,fUpdateLevel);
  Ivy_ManStop(pIVar3);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Ivy_ManRewritePre(pIVar2,fUpdateLevel,1,0);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Rewrite");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pIVar3 = Ivy_ManBalance(pIVar2,fUpdateLevel);
  Ivy_ManStop(pIVar2);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar6 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    Ivy_ManPrintStats(pIVar3);
  }
  return pIVar3;
}

Assistant:

Ivy_Man_t * Ivy_ManResyn( Ivy_Man_t * pMan, int fUpdateLevel, int fVerbose )
{
    abctime clk;
    Ivy_Man_t * pTemp;

if ( fVerbose ) { printf( "Original:\n" ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pMan, fUpdateLevel );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 0 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 1 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 1, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 1 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 1, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );
    return pMan;
}